

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

InstanceBuilder * __thiscall
vkb::InstanceBuilder::enable_extension(InstanceBuilder *this,char *extension_name)

{
  char *local_20;
  char *extension_name_local;
  InstanceBuilder *this_local;
  
  if (extension_name != (char *)0x0) {
    local_20 = extension_name;
    extension_name_local = (char *)this;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              (&(this->info).extensions,&local_20);
  }
  return this;
}

Assistant:

InstanceBuilder& InstanceBuilder::enable_extension(const char* extension_name) {
    if (!extension_name) return *this;
    info.extensions.push_back(extension_name);
    return *this;
}